

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aligned_buf.h
# Opt level: O1

void * __thiscall bsplib::AlignedBuf::append(AlignedBuf *this,size_t extra_bytes)

{
  ulong uVar1;
  size_t __n;
  size_t sVar2;
  void *pvVar3;
  ulong uVar4;
  void *__dest;
  ulong uVar5;
  long lVar6;
  
  uVar1 = this->m_alignment;
  uVar5 = (uVar1 + extra_bytes) - 1;
  lVar6 = uVar5 - uVar5 % uVar1;
  __n = this->m_size;
  uVar5 = __n + lVar6;
  if (this->m_capacity < uVar5) {
    uVar4 = this->m_capacity * 2;
    if (uVar4 <= uVar5) {
      uVar4 = uVar5;
    }
    pvVar3 = malloc(uVar1 * 2 + uVar4);
    uVar5 = (long)pvVar3 + (uVar1 - 1);
    __dest = (void *)(uVar5 - uVar5 % uVar1);
    memcpy(__dest,this->m_aligned_ptr,__n);
    free(this->m_ptr);
    this->m_ptr = pvVar3;
    this->m_aligned_ptr = __dest;
    this->m_capacity = uVar4;
  }
  sVar2 = this->m_size;
  this->m_size = lVar6 + sVar2;
  return (void *)((long)this->m_aligned_ptr + sVar2);
}

Assistant:

void * append( size_t extra_bytes ) {
        extra_bytes = align( extra_bytes );
        if ( m_size + extra_bytes > m_capacity ) {
            size_t newsize = std::max( 2 * m_capacity, m_size + extra_bytes );
            void * ptr = std::malloc( newsize + 2*m_alignment );
            void * aligned_ptr = align( ptr );
            std::memcpy( aligned_ptr, m_aligned_ptr, m_size );

            std::free( m_ptr );
            m_ptr = ptr;
            m_aligned_ptr = aligned_ptr; 
            m_capacity = newsize;
        }

        void * result = static_cast<char*>( m_aligned_ptr ) + m_size;
        m_size += extra_bytes;
        return result;
    }